

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_insert_insert_or_assign_Test::test_matrix_sparse_insert_insert_or_assign_Test
          (test_matrix_sparse_insert_insert_or_assign_Test *this)

{
  test_matrix_sparse_insert_insert_or_assign_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__test_matrix_sparse_insert_insert_or_assign_Test_001f5880;
  return;
}

Assistant:

TEST(test_matrix_sparse, insert_insert_or_assign) {
  Matrix_Sparse matrix;
  matrix.resize(5, 5);

  matrix.insert(3, 2, 1);
  EXPECT_EQ(matrix.size_non_zero(), 1);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  auto iter_bool_pair = matrix.insert(3, 1, 3);  // out of order testing - will check order at the end.
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 3.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(2, 1, 4);
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 4.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_DOUBLE_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(2, 4, 5);  // last of columns test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 5.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 4);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);

  iter_bool_pair = matrix.insert(4, 0, 8);  // last of rows test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 8.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);

  iter_bool_pair = matrix.insert(4, 4, -5);  // last row and column test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, -5.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 6);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);
  EXPECT_DOUBLE_EQ(matrix[4][4], -5.0);

  iter_bool_pair = matrix.insert(3, 2, 2.0);  // no insert test
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 1.0);
  EXPECT_FALSE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_non_zero(), 6);
  EXPECT_DOUBLE_EQ(matrix[2][1], 4.0);
  EXPECT_DOUBLE_EQ(matrix[2][4], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix[3][2], 1.0);
  EXPECT_DOUBLE_EQ(matrix[4][0], 8.0);
  EXPECT_DOUBLE_EQ(matrix[4][4], -5.0);

  iter_bool_pair = matrix.insert(6, 2, 10.0);  // extra rows
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 10.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 7);
  EXPECT_DOUBLE_EQ(matrix[6][2], 10.0);

  iter_bool_pair = matrix.insert(2, 6, 50.0);  // extra columns
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, 50.0);
  EXPECT_TRUE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_column(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 8);
  EXPECT_DOUBLE_EQ(matrix[2][6], 50.0);

  iter_bool_pair = matrix.insert_or_assign(2, 6, -50.0);  // check insert_or_assign
  EXPECT_DOUBLE_EQ(*iter_bool_pair.first, -50.0);
  EXPECT_FALSE(iter_bool_pair.second);
  EXPECT_EQ(matrix.size_row(), 7);
  EXPECT_EQ(matrix.size_column(), 7);
  EXPECT_EQ(matrix.size_non_zero(), 8);
  EXPECT_DOUBLE_EQ(matrix[2][6], -50.0);

  // check ascending order has been maintained.
  FOR_EACH(row_vector, matrix) {
    auto prev = row_vector.begin();
    FOR_ITER(iter, row_vector) {
      if(iter != row_vector.begin()) {
        EXPECT_GT(iter.i_column(), prev.i_column());
        EXPECT_EQ(iter.i_row(), prev.i_row());  // more of a sanity check.
        ++prev;
      }
    }
  }
}